

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object_detection.cpp
# Opt level: O0

void __thiscall ncnn::ObjectsManager::~ObjectsManager(ObjectsManager *this)

{
  reference ppSVar1;
  vector<ncnn::SafeOrderList<ncnn::ObjectBox>_*,_std::allocator<ncnn::SafeOrderList<ncnn::ObjectBox>_*>_>
  *in_RDI;
  int i;
  SafeOrderList<ncnn::ObjectBox> *this_00;
  undefined4 in_stack_fffffffffffffff0;
  int iVar2;
  
  for (iVar2 = 0;
      (pointer)(long)iVar2 <
      in_RDI[1].
      super__Vector_base<ncnn::SafeOrderList<ncnn::ObjectBox>_*,_std::allocator<ncnn::SafeOrderList<ncnn::ObjectBox>_*>_>
      ._M_impl.super__Vector_impl_data._M_start; iVar2 = iVar2 + 1) {
    ppSVar1 = std::
              vector<ncnn::SafeOrderList<ncnn::ObjectBox>_*,_std::allocator<ncnn::SafeOrderList<ncnn::ObjectBox>_*>_>
              ::operator[](in_RDI,(long)iVar2);
    this_00 = *ppSVar1;
    if (this_00 != (SafeOrderList<ncnn::ObjectBox> *)0x0) {
      SafeOrderList<ncnn::ObjectBox>::~SafeOrderList(this_00);
      operator_delete(this_00,0x48);
    }
    ppSVar1 = std::
              vector<ncnn::SafeOrderList<ncnn::ObjectBox>_*,_std::allocator<ncnn::SafeOrderList<ncnn::ObjectBox>_*>_>
              ::operator[](in_RDI,(long)iVar2);
    *ppSVar1 = (value_type)0x0;
  }
  std::
  vector<ncnn::SafeOrderList<ncnn::ObjectBox>_*,_std::allocator<ncnn::SafeOrderList<ncnn::ObjectBox>_*>_>
  ::clear((vector<ncnn::SafeOrderList<ncnn::ObjectBox>_*,_std::allocator<ncnn::SafeOrderList<ncnn::ObjectBox>_*>_>
           *)0x1c777e);
  std::
  vector<ncnn::SafeOrderList<ncnn::ObjectBox>_*,_std::allocator<ncnn::SafeOrderList<ncnn::ObjectBox>_*>_>
  ::~vector((vector<ncnn::SafeOrderList<ncnn::ObjectBox>_*,_std::allocator<ncnn::SafeOrderList<ncnn::ObjectBox>_*>_>
             *)CONCAT44(iVar2,in_stack_fffffffffffffff0));
  return;
}

Assistant:

ObjectsManager::~ObjectsManager()
{
    for (int i = 0; i < prob_steps; i++)
    {
        delete object_boxs_table[i];
        object_boxs_table[i] = NULL;
    }
    object_boxs_table.clear();
}